

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBooleanStateQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::BooleanStateQueryTests::init
          (BooleanStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined1 uVar1;
  undefined4 uVar2;
  TestContext *pTVar3;
  Context *pCVar4;
  int iVar5;
  IsEnabledVerifier *pIVar6;
  undefined4 extraout_var;
  GetBooleanVerifier *pGVar7;
  undefined4 extraout_var_00;
  GetIntegerVerifier *pGVar8;
  undefined4 extraout_var_01;
  GetFloatVerifier *pGVar9;
  undefined4 extraout_var_02;
  long *plVar10;
  long lVar11;
  ApiCase *pAVar12;
  long *extraout_RAX;
  long *plVar13;
  int _verifierNdx;
  long lVar14;
  StateVerifier *normalVerifiers [3];
  StateVerifier *isEnabledVerifiers [4];
  long *local_e0;
  long local_d0;
  long lStack_c8;
  long *local_c0 [2];
  long local_b0 [2];
  BooleanStateQueryTests *local_a0;
  allocator<char> local_91;
  ApiCase *local_90;
  GetBooleanVerifier *local_88;
  GetIntegerVerifier *local_80;
  GetFloatVerifier *local_78;
  long local_70;
  long local_68;
  TestContext *local_60;
  IsEnabledVerifier *local_58;
  GetBooleanVerifier *local_50;
  GetIntegerVerifier *local_48;
  GetFloatVerifier *local_40;
  
  pIVar6 = (IsEnabledVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pIVar6->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pIVar6->super_StateVerifier).m_testNamePostfix = "_isenabled";
  (pIVar6->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pIVar6->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0212e878;
  this->m_verifierIsEnabled = pIVar6;
  pGVar7 = (GetBooleanVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar7->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_00,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar7->super_StateVerifier).m_testNamePostfix = "_getboolean";
  (pGVar7->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar7->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0212e8b0;
  this->m_verifierBoolean = pGVar7;
  pGVar8 = (GetIntegerVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar8->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_01,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar8->super_StateVerifier).m_testNamePostfix = "_getinteger";
  (pGVar8->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar8->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0212e8e8;
  this->m_verifierInteger = pGVar8;
  pGVar9 = (GetFloatVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar9->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_02,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar9->super_StateVerifier).m_testNamePostfix = "_getfloat";
  (pGVar9->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar9->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0212e920;
  this->m_verifierFloat = pGVar9;
  local_58 = this->m_verifierIsEnabled;
  local_50 = this->m_verifierBoolean;
  local_48 = this->m_verifierInteger;
  local_40 = pGVar9;
  local_88 = this->m_verifierBoolean;
  local_80 = this->m_verifierInteger;
  local_78 = pGVar9;
  lVar11 = 0;
  local_a0 = this;
  do {
    lVar14 = 0;
    local_70 = lVar11;
    do {
      local_e0 = &local_d0;
      pTVar3 = (TestContext *)(&local_58)[lVar14];
      local_90 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_c0,(&PTR_anon_var_dwarf_1a84506_0212e980)[lVar11 * 3],&local_91);
      plVar10 = (long *)std::__cxx11::string::append((char *)local_c0);
      pAVar12 = local_90;
      plVar13 = plVar10 + 2;
      if ((long *)*plVar10 == plVar13) {
        local_d0 = *plVar13;
        lStack_c8 = plVar10[3];
      }
      else {
        local_d0 = *plVar13;
        local_e0 = (long *)*plVar10;
      }
      *plVar10 = (long)plVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      uVar2 = (&DAT_0212e990)[lVar11 * 6];
      uVar1 = (&DAT_0212e994)[lVar11 * 0x18];
      local_68 = lVar14;
      local_60 = pTVar3;
      ApiCase::ApiCase(local_90,pCVar4,(char *)local_e0,(char *)(&DAT_0212e988)[lVar11 * 3]);
      this = local_a0;
      (pAVar12->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0212eb08;
      *(undefined4 *)&pAVar12[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar2
      ;
      *(undefined1 *)
       ((long)&pAVar12[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar1;
      pAVar12[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = local_60;
      tcu::TestNode::addChild((TestNode *)local_a0,(TestNode *)pAVar12);
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      lVar14 = local_68;
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0],local_b0[0] + 1);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    lVar11 = local_70 + 1;
  } while (lVar11 != 9);
  lVar11 = 0;
  do {
    pGVar7 = (&local_88)[lVar11];
    pAVar12 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_a0->super_TestCaseGroup).m_context;
    local_c0[0] = local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"sample_coverage_invert","");
    plVar10 = (long *)std::__cxx11::string::append((char *)local_c0);
    local_e0 = &local_d0;
    plVar13 = plVar10 + 2;
    if ((long *)*plVar10 == plVar13) {
      local_d0 = *plVar13;
      lStack_c8 = plVar10[3];
    }
    else {
      local_d0 = *plVar13;
      local_e0 = (long *)*plVar10;
    }
    *plVar10 = (long)plVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar12,pCVar4,(char *)local_e0,"SAMPLE_COVERAGE_INVERT");
    (pAVar12->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0212eb60;
    pAVar12[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_a0,(TestNode *)pAVar12);
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  lVar11 = 0;
  do {
    pGVar7 = (&local_88)[lVar11];
    pAVar12 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_a0->super_TestCaseGroup).m_context;
    local_c0[0] = local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"color_writemask","");
    plVar10 = (long *)std::__cxx11::string::append((char *)local_c0);
    local_e0 = &local_d0;
    plVar13 = plVar10 + 2;
    if ((long *)*plVar10 == plVar13) {
      local_d0 = *plVar13;
      lStack_c8 = plVar10[3];
    }
    else {
      local_d0 = *plVar13;
      local_e0 = (long *)*plVar10;
    }
    *plVar10 = (long)plVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar12,pCVar4,(char *)local_e0,"COLOR_WRITEMASK");
    (pAVar12->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0212ebb8;
    pAVar12[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_a0,(TestNode *)pAVar12);
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  lVar11 = 0;
  do {
    pGVar7 = (&local_88)[lVar11];
    pAVar12 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_a0->super_TestCaseGroup).m_context;
    local_c0[0] = local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"depth_writemask","");
    plVar10 = (long *)std::__cxx11::string::append((char *)local_c0);
    local_e0 = &local_d0;
    plVar13 = plVar10 + 2;
    if ((long *)*plVar10 == plVar13) {
      local_d0 = *plVar13;
      lStack_c8 = plVar10[3];
    }
    else {
      local_d0 = *plVar13;
      local_e0 = (long *)*plVar10;
    }
    *plVar10 = (long)plVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar12,pCVar4,(char *)local_e0,"DEPTH_WRITEMASK");
    (pAVar12->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0212ec10;
    pAVar12[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_a0,(TestNode *)pAVar12);
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  lVar11 = 0;
  do {
    pGVar7 = (&local_88)[lVar11];
    pAVar12 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (local_a0->super_TestCaseGroup).m_context;
    local_c0[0] = local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"shader_compiler","");
    plVar10 = (long *)std::__cxx11::string::append((char *)local_c0);
    local_e0 = &local_d0;
    plVar13 = plVar10 + 2;
    if ((long *)*plVar10 == plVar13) {
      local_d0 = *plVar13;
      lStack_c8 = plVar10[3];
    }
    else {
      local_d0 = *plVar13;
      local_e0 = (long *)*plVar10;
    }
    *plVar10 = (long)plVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ApiCase::ApiCase(pAVar12,pCVar4,(char *)local_e0,"SHADER_COMPILER");
    (pAVar12->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0212ec68;
    pAVar12[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_a0,(TestNode *)pAVar12);
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    plVar10 = local_b0;
    if (local_c0[0] != plVar10) {
      operator_delete(local_c0[0],local_b0[0] + 1);
      plVar10 = extraout_RAX;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  return (int)plVar10;
}

Assistant:

void BooleanStateQueryTests::init (void)
{
	DE_ASSERT(m_verifierIsEnabled == DE_NULL);
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierIsEnabled		= new IsEnabledVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	StateVerifier* isEnabledVerifiers[] = {m_verifierIsEnabled, m_verifierBoolean, m_verifierInteger, m_verifierFloat};
	StateVerifier* normalVerifiers[]	= {						m_verifierBoolean, m_verifierInteger, m_verifierFloat};

	struct StateBoolean
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		bool			value;
	};
	const StateBoolean isEnableds[] =
	{
		{ "cull_face",						"CULL_FACE",						GL_CULL_FACE,						false},
		{ "polygon_offset_fill",			"POLYGON_OFFSET_FILL",				GL_POLYGON_OFFSET_FILL,				false},
		{ "sample_alpha_to_coverage",		"SAMPLE_ALPHA_TO_COVERAGE",			GL_SAMPLE_ALPHA_TO_COVERAGE,		false},
		{ "sample_coverage",				"SAMPLE_COVERAGE",					GL_SAMPLE_COVERAGE,					false},
		{ "scissor_test",					"SCISSOR_TEST",						GL_SCISSOR_TEST,					false},
		{ "stencil_test",					"STENCIL_TEST",						GL_STENCIL_TEST,					false},
		{ "depth_test",						"DEPTH_TEST",						GL_DEPTH_TEST,						false},
		{ "blend",							"BLEND",							GL_BLEND,							false},
		{ "dither",							"DITHER",							GL_DITHER,							true },
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(isEnableds); testNdx++)
		FOR_EACH_VERIFIER(isEnabledVerifiers, addChild(new IsEnabledStateTestCase(m_context, verifier, (std::string(isEnableds[testNdx].name) + verifier->getTestNamePostfix()).c_str(), isEnableds[testNdx].description, isEnableds[testNdx].targetName, isEnableds[testNdx].value)));

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new SampleCoverageInvertTestCase				(m_context, verifier, (std::string("sample_coverage_invert")				+ verifier->getTestNamePostfix()).c_str(), "SAMPLE_COVERAGE_INVERT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ColorMaskTestCase							(m_context, verifier, (std::string("color_writemask")						+ verifier->getTestNamePostfix()).c_str(), "COLOR_WRITEMASK")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DepthWriteMaskTestCase						(m_context, verifier, (std::string("depth_writemask")						+ verifier->getTestNamePostfix()).c_str(), "DEPTH_WRITEMASK")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ShaderCompilerTestCase						(m_context, verifier, (std::string("shader_compiler")						+ verifier->getTestNamePostfix()).c_str(), "SHADER_COMPILER")));
}